

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var.c
# Opt level: O3

tool_var * varcontent(GlobalConfig *global,char *name,size_t nlen)

{
  tool_var *ptVar1;
  int iVar2;
  size_t sVar3;
  
  ptVar1 = global->variables;
  while( true ) {
    if (ptVar1 == (tool_var *)0x0) {
      return (tool_var *)0x0;
    }
    sVar3 = strlen(ptVar1->name);
    if ((sVar3 == nlen) && (iVar2 = strncmp(name,ptVar1->name,nlen), iVar2 == 0)) break;
    ptVar1 = ptVar1->next;
  }
  return ptVar1;
}

Assistant:

static const struct tool_var *varcontent(struct GlobalConfig *global,
                                         const char *name, size_t nlen)
{
  struct tool_var *list = global->variables;
  while(list) {
    if((strlen(list->name) == nlen) &&
       !strncmp(name, list->name, nlen)) {
      return list;
    }
    list = list->next;
  }
  return NULL;
}